

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

int HorseTrap(Situation *s)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int i;
  long lVar12;
  int local_48;
  int local_44;
  long local_40;
  int *local_38;
  
  piVar7 = &local_44;
  bVar3 = true;
  lVar10 = 0;
  do {
    lVar11 = lVar10 * 0x10 + 0x10;
    *piVar7 = 0;
    lVar12 = 5;
    iVar8 = 0;
    local_40 = lVar11;
    local_38 = piVar7;
    do {
      bVar1 = s->current_pieces[lVar12 + lVar11];
      if ((ulong)bVar1 != 0) {
        iVar6 = HORSE_CAN_GET[bVar1][0];
        if (iVar6 == 0) {
          iVar6 = 10;
        }
        else {
          lVar9 = (ulong)bVar1 * 0x28;
          bVar2 = false;
          do {
            bVar4 = bVar2;
            if ((((EDGE_SQUARES[iVar6] == false) && (s->current_board[iVar6] == '\0')) &&
                (s->current_board[*(int *)((long)HORSE_LEG[0] + lVar9)] == '\0')) &&
               ((bVar5 = IfProtected((uint)lVar10 ^ 1,iVar6,s,0), !bVar5 &&
                (piVar7 = local_38, lVar11 = local_40, bVar4 = true, bVar2)))) goto LAB_0010d4d8;
            bVar2 = bVar4;
            iVar6 = *(int *)((long)HORSE_CAN_GET[0] + lVar9 + 4);
            lVar9 = lVar9 + 4;
          } while (iVar6 != 0);
          iVar6 = (uint)!bVar2 * 5 + 5;
          piVar7 = local_38;
          lVar11 = local_40;
        }
        iVar8 = iVar8 + iVar6;
        *piVar7 = iVar8;
      }
LAB_0010d4d8:
      lVar12 = lVar12 + 1;
    } while (lVar12 != 7);
    lVar10 = 1;
    piVar7 = &local_48;
    bVar2 = !bVar3;
    bVar3 = false;
    if (bVar2) {
      iVar8 = -(local_48 - local_44);
      if (s->current_player == 0) {
        iVar8 = local_48 - local_44;
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

int HorseTrap(Situation &s)
{
    int side_tag;
    int moveble;
    int horse_traps_value[2];
    int *horse_dst, *horse_leg;
    int dst;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        horse_traps_value[r] = 0;
        // 考虑马可以走的位置，走到棋盘边缘上，或者走到对方的控制格，都必须排除
        for (int i = 5; i <= 6; i++)
        {
            int pos = s.current_pieces[side_tag + i];
            if (pos != 0)
            {
                moveble = 0;
                horse_dst = HORSE_CAN_GET[pos];
                horse_leg = HORSE_LEG[pos];
                dst = *horse_dst;
                while (dst)
                {
                    if (!EDGE_SQUARES[dst] && !s.current_board[dst] && !s.current_board[*horse_leg] && !IfProtected(1 - r, dst, s))
                    {
                        moveble++;
                        if (moveble > 1)
                            break;
                    }
                    horse_dst++;
                    dst = *horse_dst;
                    horse_leg++;
                }
                // 没有好的着法的马给予10分罚分，只有一个好的着法的马给予5分罚分
                if (!moveble)
                    horse_traps_value[r] += 10;
                else if (moveble == 1)
                    horse_traps_value[r] += 5;
            }
        }
    }
    return SideValue(s.current_player, horse_traps_value[1] - horse_traps_value[0]);
}